

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O1

string * XmlRpc::XmlRpcUtil::xmlDecode(string *__return_storage_ptr__,string *encoded)

{
  char *__s1;
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  char cVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar5 = std::__cxx11::string::find((char)encoded,0x26);
  if (uVar5 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (encoded->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + encoded->_M_string_length);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)encoded,0,uVar5);
    uVar1 = encoded->_M_string_length;
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    if (uVar5 != uVar1) {
      pcVar2 = (encoded->_M_dataplus)._M_p;
      do {
        uVar8 = uVar5 + 1;
        cVar7 = (char)__return_storage_ptr__;
        if (uVar8 < uVar1 && (encoded->_M_dataplus)._M_p[uVar5] == '&') {
          __s1 = pcVar2 + uVar5 + 1;
          iVar3 = strncmp(__s1,"lt;",3);
          if (iVar3 == 0) {
            lVar6 = 4;
            bVar9 = false;
          }
          else {
            lVar6 = 0;
            do {
              bVar9 = lVar6 == 4;
              uVar8 = uVar5;
              if (bVar9) goto LAB_0024ecce;
              iVar3 = xmlEntLen[lVar6 + 1];
              iVar4 = strncmp(__s1,xmlEntity[lVar6 + 1],(long)iVar3);
              lVar6 = lVar6 + 1;
            } while (iVar4 != 0);
            lVar6 = (long)iVar3 + 1;
          }
          std::__cxx11::string::push_back(cVar7);
          uVar8 = uVar5 + lVar6;
LAB_0024ecce:
          if (bVar9) {
            std::__cxx11::string::push_back(cVar7);
            uVar8 = uVar8 + 1;
          }
        }
        else {
          std::__cxx11::string::push_back(cVar7);
        }
        uVar5 = uVar8;
      } while (uVar8 != uVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string 
XmlRpcUtil::xmlDecode(const std::string& encoded)
{
  std::string::size_type iAmp = encoded.find(AMP);
  if (iAmp == std::string::npos)
    return encoded;

  std::string decoded(encoded, 0, iAmp);
  std::string::size_type iSize = encoded.size();
  decoded.reserve(iSize);

  const char* ens = encoded.c_str();
  while (iAmp != iSize) {
    if (encoded[iAmp] == AMP && iAmp+1 < iSize) {
      int iEntity;
      for (iEntity=0; xmlEntity[iEntity] != 0; ++iEntity)
	//if (encoded.compare(iAmp+1, xmlEntLen[iEntity], xmlEntity[iEntity]) == 0)
	if (strncmp(ens+iAmp+1, xmlEntity[iEntity], xmlEntLen[iEntity]) == 0)
        {
          decoded += rawEntity[iEntity];
          iAmp += xmlEntLen[iEntity]+1;
          break;
        }
      if (xmlEntity[iEntity] == 0)    // unrecognized sequence
        decoded += encoded[iAmp++];

    } else {
      decoded += encoded[iAmp++];
    }
  }
    
  return decoded;
}